

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void ossl_close(ssl_connect_data *connssl)

{
  if ((SSL *)connssl->handle != (SSL *)0x0) {
    SSL_shutdown((SSL *)connssl->handle);
    SSL_set_connect_state((SSL *)connssl->handle);
    SSL_free((SSL *)connssl->handle);
    connssl->handle = (SSL *)0x0;
  }
  if ((SSL_CTX *)connssl->ctx != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)connssl->ctx);
    connssl->ctx = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

static void ossl_close(struct ssl_connect_data *connssl)
{
  if(connssl->handle) {
    (void)SSL_shutdown(connssl->handle);
    SSL_set_connect_state(connssl->handle);

    SSL_free(connssl->handle);
    connssl->handle = NULL;
  }
  if(connssl->ctx) {
    SSL_CTX_free(connssl->ctx);
    connssl->ctx = NULL;
  }
}